

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O3

void __thiscall
ApprovalTests::CIBuildOnlyReporter::CIBuildOnlyReporter
          (CIBuildOnlyReporter *this,shared_ptr<ApprovalTests::Reporter> *reporter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__CIBuildOnlyReporter_00142958;
  (this->m_reporter).super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (reporter->super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (reporter->super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_reporter).super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

CIBuildOnlyReporter::CIBuildOnlyReporter(std::shared_ptr<Reporter> reporter)
        : m_reporter(reporter)
    {
    }